

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::SrcDir_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_R8;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  undefined1 local_80 [8];
  FilePath argv_0;
  FilePath local_40;
  char *local_20;
  
  local_20 = "TEST_SRCDIR";
  internal::GetArgvs_abi_cxx11_();
  internal::FilePath::FilePath((FilePath *)local_80,(string *)local_40.pathname_._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_40);
  internal::FilePath::RemoveFileName(&local_40,(FilePath *)local_80);
  std::__cxx11::string::string
            ((string *)(argv_0.pathname_.field_2._M_local_buf + 8),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)local_80);
  environment_variables._M_len = argv_0.pathname_.field_2._8_8_;
  environment_variables._M_array = (iterator)0x1;
  GetDirFromEnv_abi_cxx11_(in_RDI,(testing *)&local_20,environment_variables,in_R8,in_R9B);
  std::__cxx11::string::~string((string *)(argv_0.pathname_.field_2._M_local_buf + 8));
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}